

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::FboHelper::readPixels
          (FboHelper *this,int x,int y,PixelBufferAccess *dst)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  int height;
  int width;
  Functions *gl;
  PixelBufferAccess *dst_local;
  int y_local;
  int x_local;
  FboHelper *this_local;
  long lVar5;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess);
  iVar3 = tcu::ConstPixelBufferAccess::getHeight(&dst->super_ConstPixelBufferAccess);
  if (this->m_numSamples != 0) {
    pcVar1 = *(code **)(lVar5 + 0x78);
    dVar4 = glu::ObjectWrapper::operator*(&(this->m_resolveFramebuffer).super_ObjectWrapper);
    (*pcVar1)(0x8ca9,dVar4);
    (**(code **)(lVar5 + 0x140))(x,y,iVar2,iVar3,x,y,iVar2,iVar3,0x4000,0x2600);
    pcVar1 = *(code **)(lVar5 + 0x78);
    dVar4 = glu::ObjectWrapper::operator*(&(this->m_resolveFramebuffer).super_ObjectWrapper);
    (*pcVar1)(0x8ca8,dVar4);
  }
  glu::readPixels(this->m_renderCtx,x,y,dst);
  return;
}

Assistant:

void FboHelper::readPixels (int x, int y, const tcu::PixelBufferAccess& dst)
{
	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	const int				width	= dst.getWidth();
	const int				height	= dst.getHeight();

	if (m_numSamples != 0)
	{
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, *m_resolveFramebuffer);
		gl.blitFramebuffer(x, y, width, height, x, y, width, height, GL_COLOR_BUFFER_BIT, GL_NEAREST);
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, *m_resolveFramebuffer);
	}

	glu::readPixels(m_renderCtx, x, y, dst);
}